

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

int output_flush(archive_write_filter *f)

{
  void *pvVar1;
  int iVar2;
  int ret;
  private_data_conflict5 *state;
  archive_write_filter *f_local;
  
  pvVar1 = f->data;
  if (*(int *)((long)pvVar1 + 0x6516c) % 8 != 0) {
    *(int *)((long)pvVar1 + 0x18) = (*(int *)((long)pvVar1 + 0x6516c) % 8 + 7) / 8;
    iVar2 = output_byte(f,*(uchar *)((long)pvVar1 + 0x65170));
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return 0;
}

Assistant:

static int
output_flush(struct archive_write_filter *f)
{
	struct private_data *state = f->data;
	int ret;

	/* At EOF, write the rest of the buffer. */
	if (state->bit_offset % 8) {
		state->code_len = (state->bit_offset % 8 + 7) / 8;
		ret = output_byte(f, state->bit_buf);
		if (ret != ARCHIVE_OK)
			return ret;
	}

	return (ARCHIVE_OK);
}